

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_thread.cpp
# Opt level: O0

void __thiscall tls_functor::operator()(tls_functor *this)

{
  int iVar1;
  tls_object *ptVar2;
  ostream *poVar3;
  runtime_error *prVar4;
  undefined8 *in_RDI;
  ostringstream oss_1;
  ostringstream oss;
  int v1;
  int i;
  thread_specific_ptr<tls_object> *p;
  tls_object *in_stack_fffffffffffffc18;
  thread_specific_ptr<tls_object> *in_stack_fffffffffffffc20;
  string local_360 [32];
  ostringstream local_340 [383];
  undefined1 local_1c1;
  string local_1c0 [32];
  ostringstream local_1a0 [380];
  int local_24;
  int local_20;
  undefined8 local_10;
  
  local_10 = *in_RDI;
  ptVar2 = booster::thread_specific_ptr<tls_object>::get
                     ((thread_specific_ptr<tls_object> *)0x111c8f);
  if (ptVar2 == (tls_object *)0x0) {
    ptVar2 = (tls_object *)operator_new(4);
    tls_object::tls_object(ptVar2);
    booster::thread_specific_ptr<tls_object>::reset
              (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  }
  local_20 = 0;
  while( true ) {
    if (9 < local_20) {
      ptVar2 = booster::thread_specific_ptr<tls_object>::operator->
                         ((thread_specific_ptr<tls_object> *)0x111f59);
      if (ptVar2->counter == 10) {
        return;
      }
      std::__cxx11::ostringstream::ostringstream(local_340);
      poVar3 = std::operator<<((ostream *)local_340,"Error ");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x6b);
      std::operator<<(poVar3," p->counter == 10");
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar4,local_360);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    ptVar2 = booster::thread_specific_ptr<tls_object>::operator->
                       ((thread_specific_ptr<tls_object> *)0x111d56);
    local_24 = ptVar2->counter;
    booster::ptime::millisleep((longlong)in_stack_fffffffffffffc20);
    iVar1 = local_24 + 1;
    ptVar2 = booster::thread_specific_ptr<tls_object>::operator->
                       ((thread_specific_ptr<tls_object> *)0x111d91);
    ptVar2->counter = iVar1;
    ptVar2 = booster::thread_specific_ptr<tls_object>::operator->
                       ((thread_specific_ptr<tls_object> *)0x111db0);
    if (ptVar2->counter != local_20 + 1) break;
    local_20 = local_20 + 1;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar3 = std::operator<<((ostream *)local_1a0,"Error ");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                          );
  poVar3 = std::operator<<(poVar3,":");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x69);
  std::operator<<(poVar3," p->counter == i+1");
  local_1c1 = 1;
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(prVar4,local_1c0);
  local_1c1 = 0;
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void operator()() const
	{
		try {
			booster::thread_specific_ptr<tls_object> &p=*ptr;
			if(p.get()==0)
				p.reset(new tls_object());
			for(int i=0;i<10;i++) {
				int v1 = p->counter;
				booster::ptime::millisleep(25);
				p->counter = v1+1;
				TEST(p->counter == i+1);
			}
			TEST(p->counter == 10);
		}
		catch(...) {
			tls_ok=false;
		}
	}